

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# section.cpp
# Opt level: O0

int __thiscall
section_data::slice_horiz_vertical(section_data *this,int *line_start,int *line_end,int *layer)

{
  int iVar1;
  intercept_data intercept;
  intercept_data tempy;
  int ya;
  int xb;
  int xa;
  int *layer_local;
  int *line_end_local;
  int *line_start_local;
  section_data *this_local;
  
  iVar1 = line_start[1];
  if ((((*line_start <= this->x1) && (this->x1 <= *line_end)) && (this->y1 <= iVar1)) &&
     (iVar1 <= this->y2)) {
    intercept.y = iVar1;
    intercept.x = this->x1;
    intercept.dist = iVar1 - this->y1;
    push_intercept(this,layer,intercept);
  }
  return 0;
}

Assistant:

int section_data::slice_horiz_vertical(int line_start[2], int line_end[2],
                                       int &layer)
{
  int xa = line_start[0];
  int xb = line_end[0];
  int ya = line_start[1];
  intercept_data tempy;
  if ((x1 >= xa) && (x1 <= xb) && (ya >= y1) && (ya <= y2)) {
    tempy.x = x1;
    tempy.y = ya;
    tempy.dist = ya - y1;
    push_intercept(layer, tempy);
  }
  return EXIT_SUCCESS;
}